

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpotController.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5ea27a::SpotController::on_create
          (SpotController *this,Caliper *param_1,Channel *param_2)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  ConfigManager *this_00;
  string local_238;
  undefined1 local_218 [248];
  ios_base local_120 [264];
  int local_18;
  
  this_00 = &this->m_timeseries_mgr;
  bVar1 = cali::ConfigManager::error(this_00);
  if (bVar1) {
    poVar3 = (ostream *)local_218;
    std::ofstream::ofstream(poVar3);
    local_18 = 0;
    iVar2 = cali::Log::verbosity();
    if (local_18 <= iVar2) {
      poVar3 = cali::Log::get_stream((Log *)local_218);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,"[spot controller]: Timeseries config error: ",0x2c);
    cali::ConfigManager::error_msg_abi_cxx11_(&local_238,this_00);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_238._M_dataplus._M_p,local_238._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    }
    local_218._0_8_ = _VTT;
    *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18)) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf((filebuf *)(local_218 + 8));
    std::ios_base::~ios_base(local_120);
  }
  cali::ConfigManager::start(this_00);
  return;
}

Assistant:

void on_create(Caliper*, Channel&) override
    {
        if (m_timeseries_mgr.error())
            Log(0).stream() << "[spot controller]: Timeseries config error: " << m_timeseries_mgr.error_msg()
                            << std::endl;

        m_timeseries_mgr.start();
    }